

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_create.cpp
# Opt level: O2

bool CreateHddImage(string *path,int nSizeMB_)

{
  bool bVar1;
  exception *this;
  long llTotalBytes_;
  bool bVar2;
  shared_ptr<HDD> hdd;
  
  llTotalBytes_ = opt.sectors << 9;
  if (opt.sectors == -1) {
    llTotalBytes_ = (long)nSizeMB_ << 0x14;
  }
  if (llTotalBytes_ < 0x400000) {
    this = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[53]>
              (this,(char (*) [53])"needs image size in MB (>=4) or sector count with -s");
    __cxa_throw(this,&util::exception::typeinfo,std::runtime_error::~runtime_error);
  }
  HDD::CreateDisk((HDD *)&hdd,path,llTotalBytes_,(IDENTIFYDEVICE *)0x0,false);
  if (hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr == (element_type *)0x0) {
    Error("create");
  }
  else {
    bVar1 = HDD::Copy(hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr,(HDD *)0x0,
                      (hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                      total_sectors,0,0,0,"Creating");
    bVar2 = true;
    if (bVar1) goto LAB_00155c20;
    unlink((path->_M_dataplus)._M_p);
  }
  bVar2 = false;
LAB_00155c20:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&hdd.super___shared_ptr<HDD,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return bVar2;
}

Assistant:

bool CreateHddImage(const std::string& path, int nSizeMB_)
{
    bool f = false;

    // If no sector count is specified, use the size parameter
    auto total_size = (opt.sectors == -1) ?
        static_cast<int64_t>(nSizeMB_) << 20 :
        static_cast<int64_t>(opt.sectors) << 9;

    if (total_size < 4 * 1024 * 1024)
        throw util::exception("needs image size in MB (>=4) or sector count with -s");

    // Create the specified HDD image, ensuring we don't overwrite any existing file
    auto hdd = HDD::CreateDisk(path, total_size, nullptr, false);
    if (!hdd)
        Error("create");
    else
    {
        // Zero-fill up to the required sector count
        f = hdd->Copy(nullptr, hdd->total_sectors, 0, 0, 0, "Creating");

        // If anything went wrong, remove the new file
        if (!f)
            unlink(path.c_str());
    }

    return f;
}